

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_io.c
# Opt level: O0

void uo_io_execute_io(uo_cb *cb)

{
  uint uVar1;
  int __fd;
  int *__ptr;
  size_t __n;
  uint *__ptr_00;
  void *pvVar2;
  ssize_t wlen;
  ssize_t rlen;
  size_t len;
  void *buf;
  int fd;
  uint32_t events;
  uo_ioop *ioop;
  epoll_event *epevt;
  uo_cb *cb_local;
  
  __ptr_00 = (uint *)uo_cb_stack_pop(cb);
  __ptr = *(int **)(__ptr_00 + 1);
  uVar1 = *__ptr_00;
  free(__ptr_00);
  __fd = *__ptr;
  pvVar2 = *(void **)(__ptr + 2);
  __n = *(size_t *)(__ptr + 4);
  free(__ptr);
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 0x10) == 0) {
        uo_cb_stack_push(cb,(void *)0x1);
        uo_cb_stack_push(cb,(void *)0x0);
      }
      else {
        uo_cb_stack_push(cb,(void *)0x0);
        uo_cb_stack_push(cb,(void *)0x0);
      }
    }
    else {
      pvVar2 = (void *)write(__fd,pvVar2,__n);
      if (pvVar2 == (void *)0xffffffffffffffff) {
        uo_cb_stack_push(cb,(void *)0x1);
        uo_cb_stack_push(cb,(void *)0x0);
      }
      else {
        if (pvVar2 == (void *)0x0) {
          uo_cb_stack_push(cb,(void *)0x0);
        }
        uo_cb_stack_push(cb,pvVar2);
      }
    }
  }
  else {
    pvVar2 = (void *)read(__fd,pvVar2,__n);
    if (pvVar2 == (void *)0xffffffffffffffff) {
      uo_cb_stack_push(cb,(void *)0x1);
      uo_cb_stack_push(cb,(void *)0x0);
    }
    else {
      if (pvVar2 == (void *)0x0) {
        uo_cb_stack_push(cb,(void *)0x0);
      }
      uo_cb_stack_push(cb,pvVar2);
    }
  }
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void uo_io_execute_io(
        uo_cb *cb)
    {
        struct epoll_event *epevt = uo_cb_stack_pop(cb);
        uo_ioop *ioop = epevt->data.ptr;
        uint32_t events = epevt->events;
        free(epevt);

        int fd = ioop->fd;
        void *buf = ioop->buf;
        size_t len = ioop->len;
        free(ioop);

        if (events & EPOLLIN)
        {
            ssize_t rlen = read(fd, buf, len);
            switch (rlen)
            {
                case -1:
                    // TODO: specify what error occurred
                    uo_cb_stack_push(cb, (void *)(uintptr_t)UO_IO_ERR_UNKNOWN);
                    uo_cb_stack_push(cb, 0);
                    break;

                case 0:
                    uo_cb_stack_push(cb, (void *)(uintptr_t)UO_IO_ERR_NONE);
                    /* fall through */
                default:
                    uo_cb_stack_push(cb, (void *)(uintptr_t)rlen);
                    break;
            }
        }
        else if (events & EPOLLOUT)
        {
            ssize_t wlen = write(fd, buf, len);
            switch (wlen)
            {
                case -1:
                    // TODO: specify what error occurred
                    uo_cb_stack_push(cb, (void *)(uintptr_t)UO_IO_ERR_UNKNOWN);
                    uo_cb_stack_push(cb, 0);
                    break;

                case 0:
                    uo_cb_stack_push(cb, (void *)(uintptr_t)UO_IO_ERR_NONE);
                    /* fall through */
                default:
                    uo_cb_stack_push(cb, (void *)(uintptr_t)wlen);
                    break;
            }
        }
        else if (events & EPOLLHUP)
        {
            uo_cb_stack_push(cb, (void *)(uintptr_t)UO_IO_ERR_NONE);
            uo_cb_stack_push(cb, 0);
        }
        else
        {
            // TODO: specify what error occurred
            uo_cb_stack_push(cb, (void *)(uintptr_t)UO_IO_ERR_UNKNOWN);
            uo_cb_stack_push(cb, 0);
        }

        uo_cb_invoke(cb);
    }